

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

_Bool str_starts_with_any(char *haystack,char **needles,int num_needles)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  _Bool _Var4;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x251,"_Bool str_starts_with_any(const char *, const char **, int)");
  }
  if (needles == (char **)0x0) {
    __assert_fail("needles != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x252,"_Bool str_starts_with_any(const char *, const char **, int)");
  }
  if (num_needles < 0) {
    __assert_fail("num_needles >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x253,"_Bool str_starts_with_any(const char *, const char **, int)");
  }
  if (num_needles == 0) {
    _Var4 = false;
  }
  else {
    _Var4 = true;
    uVar2 = 0;
    do {
      if (needles[uVar2] == (char *)0x0) {
        __assert_fail("needles[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                      ,0x256,"_Bool str_starts_with_any(const char *, const char **, int)");
      }
      lVar3 = 0;
      do {
        cVar1 = needles[uVar2][lVar3];
        if (haystack[lVar3] != cVar1) break;
        lVar3 = lVar3 + 1;
      } while (cVar1 != '\0');
      if (cVar1 == '\0') {
        return _Var4;
      }
      uVar2 = uVar2 + 1;
      _Var4 = uVar2 < (uint)num_needles;
    } while (uVar2 != (uint)num_needles);
  }
  return _Var4;
}

Assistant:

bool str_starts_with_any(const char *haystack, const char **needles, int num_needles)
{
    assert(haystack != NULL);
    assert(needles != NULL);
    assert(num_needles >= 0);

    for (int i = 0; i < num_needles; i++) {
        assert(needles[i] != NULL);
        if (str_starts_with(haystack, needles[i]))
            return true;
    }

    return false;
}